

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O3

void continuous_dist_test_streamable<trng::student_t_dist<float>>(student_t_dist<float> *d)

{
  param_type pVar1;
  param_type p_new;
  AssertionHandler catchAssertionHandler;
  stringstream str;
  param_type local_22c;
  StringRef local_228;
  AssertionHandler local_218;
  StringRef local_1d0;
  SourceLineInfo local_1c0;
  stringstream local_1b0 [16];
  basic_ostream<char,_std::char_traits<char>_> local_1a0 [112];
  ios_base local_130 [264];
  
  local_22c.nu_ = 1;
  std::__cxx11::stringstream::stringstream(local_1b0);
  trng::operator<<(local_1a0,&d->P);
  trng::operator>>((basic_istream<char,_std::char_traits<char>_> *)local_1b0,&local_22c);
  pVar1.nu_ = local_22c.nu_;
  local_228.m_start = "REQUIRE";
  local_228.m_size = 7;
  local_1c0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_1c0.line = 0xcd;
  Catch::StringRef::StringRef(&local_1d0,"(d == d_new)");
  Catch::AssertionHandler::AssertionHandler(&local_218,&local_228,&local_1c0,local_1d0,Normal);
  local_228.m_start = (char *)CONCAT71(local_228.m_start._1_7_,(d->P).nu_ == pVar1.nu_);
  Catch::AssertionHandler::handleExpr<bool>(&local_218,(ExprLhs<bool> *)&local_228);
  Catch::AssertionHandler::complete(&local_218);
  if (local_218.m_completed == false) {
    (*(local_218.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void continuous_dist_test_streamable(dist &d) {
  typename dist::param_type p_new;
  std::stringstream str;
  str << d.param();
  str >> p_new;
  dist d_new{p_new};
  REQUIRE((d == d_new));
}